

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O1

void __thiscall chrono::utils::ChButterworth_Lowpass::Reset(ChButterworth_Lowpass *this)

{
  uint uVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  ulong uVar6;
  
  if (this->m_n_single == 1) {
    this->m_u_hist1 = 0.0;
    this->m_y_hist1 = 0.0;
  }
  uVar1 = this->m_n_biquad;
  if ((ulong)uVar1 != 0) {
    pdVar2 = (this->m_biq_u_hist1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->m_biq_u_hist2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->m_biq_y_hist2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->m_biq_y_hist1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      pdVar3[uVar6] = 0.0;
      pdVar2[uVar6] = 0.0;
      pdVar4[uVar6] = 0.0;
      pdVar5[uVar6] = 0.0;
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  return;
}

Assistant:

void ChButterworth_Lowpass::Reset() {
    if (m_n_single == 1) {
        m_u_hist1 = 0.0;
        m_y_hist1 = 0.0;
    }
    for (unsigned int i = 0; i < m_n_biquad; i++) {
        m_biq_u_hist1[i] = m_biq_u_hist2[i] = 0.0;
        m_biq_y_hist1[i] = m_biq_y_hist2[i] = 0.0;
    }
}